

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void blend_radial_gradient
               (plutovg_surface_t *surface,plutovg_operator_t op,gradient_data_t *gradient,
               plutovg_span_buffer_t *span_buffer)

{
  float fVar1;
  composition_function_t p_Var2;
  int local_1080;
  bool local_1079;
  uint32_t *target;
  int local_1068;
  int l;
  int x;
  int length;
  plutovg_span_t *spans;
  undefined1 local_1050 [4];
  int count;
  radial_gradient_values_t v;
  uint buffer [1024];
  composition_function_t func;
  plutovg_span_buffer_t *span_buffer_local;
  gradient_data_t *gradient_local;
  plutovg_operator_t op_local;
  plutovg_surface_t *surface_local;
  
  p_Var2 = composition_table[op];
  local_1050 = (undefined1  [4])((gradient->values).linear.x1 - (gradient->values).linear.y2);
  count = (int)((gradient->values).linear.y1 - (gradient->values).radial.fy);
  v.dx = (gradient->values).linear.x2 - (gradient->values).radial.fr;
  v.dy = (gradient->values).radial.fr * (gradient->values).radial.fr;
  v.dr = -(float)count * (float)count + v.dx * v.dx + -((float)local_1050 * (float)local_1050);
  fVar1 = (gradient->values).radial.fr;
  local_1079 = true;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    local_1079 = v.dr <= 0.0;
  }
  v.sqrfr._0_1_ = local_1079;
  _x = (span_buffer->spans).data;
  spans._4_4_ = (span_buffer->spans).size;
  while (spans._4_4_ != 0) {
    local_1068 = _x->x;
    for (l = _x->len; l != 0; l = l - local_1080) {
      if (l < 0x400) {
        local_1080 = l;
      }
      else {
        local_1080 = 0x400;
      }
      fetch_radial_gradient
                ((uint32_t *)&v.a,(radial_gradient_values_t *)local_1050,gradient,_x->y,local_1068,
                 local_1080);
      (*p_Var2)((uint32_t *)(surface->data + (long)local_1068 * 4 + (long)(_x->y * surface->stride))
                ,local_1080,(uint32_t *)&v.a,(uint32_t)_x->coverage);
      local_1068 = local_1080 + local_1068;
    }
    _x = _x + 1;
    spans._4_4_ = spans._4_4_ + -1;
  }
  return;
}

Assistant:

static void blend_radial_gradient(plutovg_surface_t* surface, plutovg_operator_t op, const gradient_data_t* gradient, const plutovg_span_buffer_t* span_buffer)
{
    composition_function_t func = composition_table[op];
    unsigned int buffer[BUFFER_SIZE];

    radial_gradient_values_t v;
    v.dx = gradient->values.radial.cx - gradient->values.radial.fx;
    v.dy = gradient->values.radial.cy - gradient->values.radial.fy;
    v.dr = gradient->values.radial.cr - gradient->values.radial.fr;
    v.sqrfr = gradient->values.radial.fr * gradient->values.radial.fr;
    v.a = v.dr * v.dr - v.dx * v.dx - v.dy * v.dy;
    v.extended = gradient->values.radial.fr != 0.f || v.a <= 0.f;

    int count = span_buffer->spans.size;
    const plutovg_span_t* spans = span_buffer->spans.data;
    while(count--) {
        int length = spans->len;
        int x = spans->x;
        while(length) {
            int l = plutovg_min(length, BUFFER_SIZE);
            fetch_radial_gradient(buffer, &v, gradient, spans->y, x, l);
            uint32_t* target = (uint32_t*)(surface->data + spans->y * surface->stride) + x;
            func(target, l, buffer, spans->coverage);
            x += l;
            length -= l;
        }

        ++spans;
    }
}